

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall
InitSocket::SetAddrNotifyCallback
          (InitSocket *this,
          function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
          *fnCbAddrNotify)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *__args_1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *p_Var1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *p_Var2;
  InitSocket *local_68;
  thread local_60;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  iter;
  
  std::
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  ::operator=(&this->m_fnCbAddrNotify,fnCbAddrNotify);
  if ((this->m_fnCbAddrNotify).super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var1 = &((this->m_vCurIPAddr).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ;
    __args_1 = &iter.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ;
    for (p_Var2 = &((this->m_vCurIPAddr).
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        ; p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::_Tuple_impl(&iter.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                    ,p_Var2);
      std::
      function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
      ::operator()(&this->m_fnCbAddrNotify,true,&__args_1->_M_head_impl,
                   iter.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                   .super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl,
                   (int)iter.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                        .super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl);
      std::__cxx11::string::~string((string *)__args_1);
    }
  }
  if ((this->m_thIpChange)._M_id._M_thread == 0) {
    iter.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .super__Tuple_impl<1UL,_int,_int> = (_Tuple_impl<1UL,_int,_int>)IpChangeThread;
    iter.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = (pointer)0x0;
    local_68 = this;
    std::thread::thread<void(InitSocket::*)(),InitSocket*,void>(&local_60,(type *)&iter,&local_68);
    std::thread::operator=(&this->m_thIpChange,&local_60);
    std::thread::~thread(&local_60);
  }
  return;
}

Assistant:

void InitSocket::SetAddrNotifyCallback(const function<void(bool, const string&, int, int)>& fnCbAddrNotify)
{
    m_fnCbAddrNotify = fnCbAddrNotify;
    if (m_fnCbAddrNotify)
    {   // notify on current ip addresses
        for (auto iter : m_vCurIPAddr)
            m_fnCbAddrNotify(true, get<0>(iter), get<1>(iter), get<2>(iter));
    }

#if defined(_WIN32) || defined(_WIN64)
    if (m_hIFaceNotify == nullptr)
        NotifyIpInterfaceChange(AF_UNSPEC, IpIfaceChanged, this, TRUE, &m_hIFaceNotify);
#else
    if (m_thIpChange.joinable() == false)
        m_thIpChange = thread(&InitSocket::IpChangeThread, this);
#endif
}